

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O0

OpLayoutType Js::OpCodeUtil::GetOpCodeLayout(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint opIndex;
  uint opIndex_1;
  OpCode op_local;
  
  if (op < InvalidOpCode) {
    if (MaxByteSizedOpcodes < op) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0xff,
                                  "((uint)op < (sizeof(*__countof_helper(OpCodeLayouts)) + 0))",
                                  "(uint)op < (sizeof(*__countof_helper(OpCodeLayouts)) + 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(OpCodeLayouts + (ulong)op * 4);
  }
  else if (op < ByteCodeLast) {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x88 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0x105,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeLayouts)) + 0))"
                                  ,
                                  "opIndex < (sizeof(*__countof_helper(ExtendedOpCodeLayouts)) + 0)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(ExtendedOpCodeLayouts + (ulong)uVar3 * 4);
  }
  else {
    uVar3 = Js::operator+(ByteCodeLast,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x328 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0x109,
                                  "(opIndex < (sizeof(*__countof_helper(BackendOpCodeLayouts)) + 0))"
                                  ,"opIndex < (sizeof(*__countof_helper(BackendOpCodeLayouts)) + 0)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex_1 = *(uint *)(BackendOpCodeLayouts + (ulong)uVar3 * 4);
  }
  return (OpLayoutType)opIndex_1;
}

Assistant:

OpLayoutType OpCodeUtil::GetOpCodeLayout(OpCode op)
    {
        if ((uint)op <= (uint)Js::OpCode::MaxByteSizedOpcodes)
        {
            AnalysisAssert((uint)op < _countof(OpCodeLayouts));
            return OpCodeLayouts[(uint)op];
        }
        else if (op < Js::OpCode::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
            AnalysisAssert(opIndex < _countof(ExtendedOpCodeLayouts));
            return ExtendedOpCodeLayouts[opIndex];
        }
        uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
        AnalysisAssert(opIndex < _countof(BackendOpCodeLayouts));
        return BackendOpCodeLayouts[opIndex];
    }